

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6027d3::ParameterPack::printLeft(ParameterPack *this,OutputStream *S)

{
  if (S->CurrentPackMax == 0xffffffff) {
    S->CurrentPackMax = (uint)(this->Data).NumElements;
    S->CurrentPackIndex = 0;
  }
  if ((ulong)S->CurrentPackIndex < (this->Data).NumElements) {
    (*(this->Data).Elements[S->CurrentPackIndex]->_vptr_Node[4])();
    return;
  }
  return;
}

Assistant:

void initializePackExpansion(OutputStream &S) const {
    if (S.CurrentPackMax == std::numeric_limits<unsigned>::max()) {
      S.CurrentPackMax = static_cast<unsigned>(Data.size());
      S.CurrentPackIndex = 0;
    }
  }